

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O3

char * Qiniu_MD5_HexStr(char *src)

{
  char *pcVar1;
  Qiniu_Digest *self;
  size_t sVar2;
  int i;
  long lVar3;
  uchar sign [16];
  undefined2 local_3c [2];
  byte local_38 [24];
  
  pcVar1 = (char *)malloc(0x21);
  self = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);
  sVar2 = strlen(src);
  Qiniu_Digest_Update(self,src,(int)sVar2);
  Qiniu_Digest_Final(self,local_38,(size_t *)0x0);
  Qiniu_Digest_Free(self);
  lVar3 = 0;
  do {
    snprintf((char *)local_3c,3,"%02x",(ulong)local_38[lVar3]);
    *(undefined2 *)(pcVar1 + lVar3 * 2) = local_3c[0];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  pcVar1[0x20] = '\0';
  return pcVar1;
}

Assistant:

const char *Qiniu_MD5_HexStr(const char *src)
	{
		unsigned char sign[MD5_DIGEST_LENGTH];
		int signLen = MD5_DIGEST_LENGTH * 2 + 1;
		char *signHex = (char *)malloc(sizeof(char) * signLen);
		char temp[3];
		Qiniu_Digest *md5_digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);
		Qiniu_Digest_Update(md5_digest, src, (int)strlen(src));
		Qiniu_Digest_Final(md5_digest, sign, NULL);
		Qiniu_Digest_Free(md5_digest);
		for (int i = 0; i < MD5_DIGEST_LENGTH; i++)
		{
			Qiniu_snprintf(temp, 3, "%02x", sign[i]);
			temp[2] = '\0';
			memcpy(&(signHex[i * 2]), temp, 2);
		}
		signHex[signLen - 1] = '\0';
		return signHex;
	}